

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_43(QPDF *pdf,char *arg2)

{
  QPDFFormFieldObjectHelper QVar1;
  QPDFPageObjectHelper QVar2;
  QPDFAnnotationObjectHelper QVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  char cVar5;
  int iVar6;
  ostream *poVar7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *psVar10;
  QPDFFormFieldObjectHelper parent;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annotations;
  QPDFFormFieldObjectHelper node;
  QPDFAcroFormDocumentHelper afdh;
  long *plVar11;
  code *pcVar12;
  char *pcVar13;
  undefined8 uVar14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_stack_fffffffffffffe08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffe18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1c8;
  undefined1 local_1b8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  long *local_178;
  long *local_170;
  long local_168 [2];
  string *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  string local_120 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  QPDFAcroFormDocumentHelper local_110;
  string *local_f0;
  string *local_e8;
  undefined **local_d8 [2];
  long local_c8;
  undefined8 local_c0;
  long local_b8;
  element_type *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined **local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined **local_68 [2];
  _func_int **local_58;
  undefined8 local_50;
  _func_int **local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_150 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_110,pdf);
  cVar5 = QPDFAcroFormDocumentHelper::hasAcroForm();
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no forms\n",9);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"iterating over form fields\n",0x1b);
    QPDFAcroFormDocumentHelper::getFormFields();
    local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_170;
    if (local_178 != local_170) {
      local_158 = (string *)QPDFObjectHandle::copyStream;
      plVar11 = local_178;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Field: ",7);
        pcVar13 = (char *)plVar11[1];
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[2];
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ != &local_1a8) {
          operator_delete((void *)local_1b8._0_8_,
                          (ulong)((long)&(local_1a8._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        local_1b8._8_8_ = plVar11[1];
        local_1a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[2];
        if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
          }
        }
        local_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
        local_198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[4];
        if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
          }
        }
        local_1b8._0_8_ = &PTR__QPDFFormFieldObjectHelper_00158ab8;
        local_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[5];
        local_188._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[6];
        if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
          }
        }
        while( true ) {
          cVar5 = QPDFFormFieldObjectHelper::isNull();
          if (cVar5 != '\0') break;
          QPDFFormFieldObjectHelper::getParent();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Parent: ",10);
          cVar5 = QPDFFormFieldObjectHelper::isNull();
          if (cVar5 == '\0') {
            if (in_stack_fffffffffffffe00._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (in_stack_fffffffffffffe00._M_pi)->_M_use_count =
                     (in_stack_fffffffffffffe00._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (in_stack_fffffffffffffe00._M_pi)->_M_use_count =
                     (in_stack_fffffffffffffe00._M_pi)->_M_use_count + 1;
              }
            }
            local_130 = p_Var15;
            local_128 = in_stack_fffffffffffffe00._M_pi;
            QPDFObjectHandle::unparse_abi_cxx11_();
          }
          else {
            local_1d8 = &local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"none","");
          }
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(char *)local_1d8,(long)local_1d0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,(long)local_1c8._vptr__Sp_counted_base + 1);
          }
          if ((cVar5 == '\0') && (local_128 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
          {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
          }
          local_1b8._8_8_ = p_Var15;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_1a8,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe00);
          local_1a0._M_pi = in_stack_fffffffffffffe08;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_198,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffe10);
          local_190 = in_stack_fffffffffffffe18._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_188,&local_1e0);
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                    ((QPDFFormFieldObjectHelper *)&stack0xfffffffffffffdf0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Fully qualified name: ",0x18);
        QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Partial name: ",0x10);
        QPDFFormFieldObjectHelper::getPartialName_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Alternative name: ",0x14);
        QPDFFormFieldObjectHelper::getAlternativeName_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Mapping name: ",0x10);
        QPDFFormFieldObjectHelper::getMappingName_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Field type: ",0xe);
        QPDFFormFieldObjectHelper::getFieldType_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Value: ",9);
        QPDFFormFieldObjectHelper::getValue();
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Value as string: ",0x13);
        QPDFFormFieldObjectHelper::getValueAsString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Default value: ",0x11);
        QPDFFormFieldObjectHelper::getDefaultValue();
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Default value as string: ",0x1b);
        QPDFFormFieldObjectHelper::getDefaultValueAsString_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  Default appearance: ",0x16);
        QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,pcVar13,(long)p_Var15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (pcVar13 != &stack0xfffffffffffffe00) {
          operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                 _vptr__Sp_counted_base + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Quadding: ",0xc)
        ;
        iVar6 = QPDFFormFieldObjectHelper::getQuadding();
        plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
        local_98 = plVar11[1];
        local_90 = plVar11[2];
        if (local_90 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_90 + 8) = *(int *)(local_90 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_90 + 8) = *(int *)(local_90 + 8) + 1;
          }
        }
        local_88 = plVar11[3];
        local_80 = plVar11[4];
        if (local_80 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
          }
        }
        local_a0 = &PTR__QPDFFormFieldObjectHelper_00158ab8;
        local_78 = (element_type *)plVar11[5];
        local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[6];
        if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_70._M_pi)->_M_use_count = (local_70._M_pi)->_M_use_count + 1;
          }
        }
        QVar1._8_8_ = pcVar13;
        QVar1._0_8_ = plVar11;
        QVar1._16_8_ = p_Var15;
        QVar1._24_8_ = in_stack_fffffffffffffe00._M_pi;
        QVar1._32_8_ = in_stack_fffffffffffffe08;
        QVar1.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)in_stack_fffffffffffffe10._M_pi;
        QVar1.m.super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_stack_fffffffffffffe18._M_pi;
        QPDFAcroFormDocumentHelper::getAnnotationsForField(QVar1);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)&local_a0);
        p_Var4 = local_1d0;
        for (p_Var9 = local_1d8; p_Var9 != p_Var4;
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&p_Var9[3]._M_use_count) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Annotation: ",0xe);
          local_148 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&p_Var9->_M_use_count;
          local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      p_Var9[1]._vptr__Sp_counted_base;
          if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_140->_M_use_count = local_140->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_140->_M_use_count = local_140->_M_use_count + 1;
            }
          }
          QPDFObjectHandle::unparse_abi_cxx11_();
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,pcVar13,(long)p_Var15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if (pcVar13 != &stack0xfffffffffffffe00) {
            operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                   _vptr__Sp_counted_base + 1));
          }
          if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
          }
        }
        std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
        ~vector((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                &local_1d8);
        QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                  ((QPDFFormFieldObjectHelper *)local_1b8);
        plVar11 = plVar11 + 7;
      } while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11 != local_180);
    }
    std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::~vector
              ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
               &local_178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"iterating over annotations per page\n",0x24);
    QPDFPageDocumentHelper::QPDFPageDocumentHelper
              ((QPDFPageDocumentHelper *)local_1b8,(QPDF *)local_150);
    QPDFPageDocumentHelper::getAllPages();
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_1b8);
    local_180 = local_148;
    local_150 = local_140;
    if (local_148 != local_140) {
      pcVar12 = QPDFObjectHandle::copyStream;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Page: ",6);
        uVar14 = *(undefined8 *)&local_180->_M_use_count;
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_180[1]._vptr__Sp_counted_base;
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        QPDFObjectHandle::unparse_abi_cxx11_();
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ != &local_1a8) {
          operator_delete((void *)local_1b8._0_8_,
                          (ulong)((long)&(local_1a8._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        local_68[1]._0_4_ = local_180->_M_use_count;
        local_68[1]._4_4_ = local_180->_M_weak_count;
        local_58 = local_180[1]._vptr__Sp_counted_base;
        if (local_58 != (_func_int **)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_58 + 1) = *(int *)(local_58 + 1) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_58 + 1) = *(int *)(local_58 + 1) + 1;
          }
        }
        local_50._0_4_ = local_180[1]._M_use_count;
        local_50._4_4_ = local_180[1]._M_weak_count;
        local_48 = local_180[2]._vptr__Sp_counted_base;
        if (local_48 != (_func_int **)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(local_48 + 1) = *(int *)(local_48 + 1) + 1;
            UNLOCK();
          }
          else {
            *(int *)(local_48 + 1) = *(int *)(local_48 + 1) + 1;
          }
        }
        local_68[0] = &PTR__QPDFPageObjectHelper_001589e8;
        local_40 = *(element_type **)&local_180[2]._M_use_count;
        local_38._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180[3]._vptr__Sp_counted_base;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
          }
        }
        QVar2._8_1_ = SUB81(uVar14,0);
        QVar2._9_7_ = SUB87(uVar14,1);
        QVar2._0_8_ = pcVar12;
        QVar2._16_8_ = p_Var15;
        QVar2._24_8_ = in_stack_fffffffffffffe00._M_pi;
        QVar2._32_8_ = in_stack_fffffffffffffe08;
        QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)in_stack_fffffffffffffe10._M_pi;
        QVar2.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_stack_fffffffffffffe18._M_pi;
        QPDFAcroFormDocumentHelper::getWidgetAnnotationsForPage(QVar2);
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_68);
        local_158 = local_e8;
        psVar10 = local_f0;
        if (local_f0 != local_e8) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  Annotation: ",0xe);
            pcVar13 = *(char **)(psVar10 + 8);
            p_Var15 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0x10);
            if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              }
            }
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,
                              (ulong)((long)&(local_1a8._M_pi)->_vptr__Sp_counted_base + 1));
            }
            if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Field: ",0xb);
            local_d8[1] = *(undefined ***)(psVar10 + 8);
            local_c8 = *(long *)(psVar10 + 0x10);
            if (local_c8 != 0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_c8 + 8) = *(int *)(local_c8 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_c8 + 8) = *(int *)(local_c8 + 8) + 1;
              }
            }
            local_c0 = *(undefined8 *)(psVar10 + 0x18);
            local_b8 = *(long *)(psVar10 + 0x20);
            if (local_b8 != 0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_b8 + 8) = *(int *)(local_b8 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_b8 + 8) = *(int *)(local_b8 + 8) + 1;
              }
            }
            local_d8[0] = &PTR__QPDFAnnotationObjectHelper_00158af0;
            local_b0 = *(element_type **)(psVar10 + 0x28);
            local_a8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(psVar10 + 0x30);
            if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
              }
            }
            QVar3._8_8_ = pcVar13;
            QVar3._0_8_ = pcVar12;
            QVar3._16_8_ = p_Var15;
            QVar3._24_8_ = in_stack_fffffffffffffe00._M_pi;
            QVar3._32_8_ = in_stack_fffffffffffffe08;
            QVar3.m.
            super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)in_stack_fffffffffffffe10._M_pi;
            QVar3.m.
            super___shared_ptr<QPDFAnnotationObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = in_stack_fffffffffffffe18._M_pi;
            QPDFAcroFormDocumentHelper::getFieldForAnnotation(QVar3);
            local_1d8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
            local_1d0 = local_1a8._M_pi;
            if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
              }
            }
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,pcVar13,(long)p_Var15);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if (pcVar13 != &stack0xfffffffffffffe00) {
              operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                     _vptr__Sp_counted_base + 1));
            }
            if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
            }
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)local_1b8);
            QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper
                      ((QPDFAnnotationObjectHelper *)local_d8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Subtype: ",0xd);
            QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,
                              (ulong)((long)&(local_1a8._M_pi)->_vptr__Sp_counted_base + 1));
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Rect: ",10);
            QPDFAnnotationObjectHelper::getRect();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
            poVar7 = std::ostream::_M_insert<double>((double)local_1b8._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_1b8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_1a8._M_pi);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<double>((double)local_1a0._M_pi);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            QPDFAnnotationObjectHelper::getAppearanceState_abi_cxx11_();
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"    Appearance state: ",0x16);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(char *)local_1b8._0_8_,local_1b8._8_8_);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Appearance stream (/N): ",0x1c);
            local_1d8 = &local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/N","");
            local_178 = local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
            QPDFAnnotationObjectHelper::getAppearanceStream(local_120,psVar10);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,pcVar13,(long)p_Var15);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if (pcVar13 != &stack0xfffffffffffffe00) {
              operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                     _vptr__Sp_counted_base + 1));
            }
            if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
            }
            if (local_178 != local_168) {
              operator_delete(local_178,local_168[0] + 1);
            }
            if (local_1d8 != &local_1c8) {
              operator_delete(local_1d8,(long)local_1c8._vptr__Sp_counted_base + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"    Appearance stream (/N, /3): ",0x20);
            local_1d8 = &local_1c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/N","");
            local_178 = local_168;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"/3","");
            QPDFAnnotationObjectHelper::getAppearanceStream(local_120,psVar10);
            QPDFObjectHandle::unparse_abi_cxx11_();
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,pcVar13,(long)p_Var15);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            if (pcVar13 != &stack0xfffffffffffffe00) {
              operator_delete(pcVar13,(ulong)((long)&(in_stack_fffffffffffffe00._M_pi)->
                                                     _vptr__Sp_counted_base + 1));
            }
            if (local_118 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118);
            }
            if (local_178 != local_168) {
              operator_delete(local_178,local_168[0] + 1);
            }
            if (local_1d8 != &local_1c8) {
              operator_delete(local_1d8,(long)local_1c8._vptr__Sp_counted_base + 1);
            }
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1b8._0_8_ != &local_1a8) {
              operator_delete((void *)local_1b8._0_8_,
                              (ulong)((long)&(local_1a8._M_pi)->_vptr__Sp_counted_base + 1));
            }
            psVar10 = psVar10 + 0x38;
          } while (psVar10 != local_158);
        }
        std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::
        ~vector((vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *)
                &local_f0);
        local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_180[3]._M_use_count;
      } while (local_180 != local_150);
    }
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
              ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_148);
  }
  QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_110);
  return;
}

Assistant:

static void
test_43(QPDF& pdf, char const* arg2)
{
    // Forms
    QPDFAcroFormDocumentHelper afdh(pdf);
    if (!afdh.hasAcroForm()) {
        std::cout << "no forms\n";
        return;
    }
    std::cout << "iterating over form fields\n";
    for (auto& ffh: afdh.getFormFields()) {
        std::cout << "Field: " << ffh.getObjectHandle().unparse() << std::endl;
        QPDFFormFieldObjectHelper node = ffh;
        while (!node.isNull()) {
            QPDFFormFieldObjectHelper parent(node.getParent());
            std::cout << "  Parent: "
                      << (parent.isNull() ? std::string("none")
                                          : parent.getObjectHandle().unparse())
                      << std::endl;
            node = parent;
        }
        std::cout << "  Fully qualified name: " << ffh.getFullyQualifiedName() << std::endl;
        std::cout << "  Partial name: " << ffh.getPartialName() << std::endl;
        std::cout << "  Alternative name: " << ffh.getAlternativeName() << std::endl;
        std::cout << "  Mapping name: " << ffh.getMappingName() << std::endl;
        std::cout << "  Field type: " << ffh.getFieldType() << std::endl;
        std::cout << "  Value: " << ffh.getValue().unparse() << std::endl;
        std::cout << "  Value as string: " << ffh.getValueAsString() << std::endl;
        std::cout << "  Default value: " << ffh.getDefaultValue().unparse() << std::endl;
        std::cout << "  Default value as string: " << ffh.getDefaultValueAsString() << std::endl;
        std::cout << "  Default appearance: " << ffh.getDefaultAppearance() << std::endl;
        std::cout << "  Quadding: " << ffh.getQuadding() << std::endl;
        std::vector<QPDFAnnotationObjectHelper> annotations = afdh.getAnnotationsForField(ffh);
        for (auto& aoh: annotations) {
            std::cout << "  Annotation: " << aoh.getObjectHandle().unparse() << std::endl;
        }
    }
    std::cout << "iterating over annotations per page\n";
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "Page: " << page.getObjectHandle().unparse() << std::endl;
        for (auto& ah: afdh.getWidgetAnnotationsForPage(page)) {
            std::cout << "  Annotation: " << ah.getObjectHandle().unparse() << std::endl;
            std::cout << "    Field: "
                      << (afdh.getFieldForAnnotation(ah).getObjectHandle().unparse()) << std::endl;
            std::cout << "    Subtype: " << ah.getSubtype() << std::endl;
            std::cout << "    Rect: ";
            print_rect(std::cout, ah.getRect());
            std::cout << std::endl;
            std::string state = ah.getAppearanceState();
            if (!state.empty()) {
                std::cout << "    Appearance state: " << state << std::endl;
            }
            std::cout << "    Appearance stream (/N): " << ah.getAppearanceStream("/N").unparse()
                      << std::endl;
            std::cout << "    Appearance stream (/N, /3): "
                      << ah.getAppearanceStream("/N", "/3").unparse() << std::endl;
        }
    }
}